

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O2

void __thiscall UnitTest_lex1::Run(UnitTest_lex1 *this)

{
  int iVar1;
  LexerWrapper lexer;
  allocator local_159;
  string local_158;
  LexerWrapper local_138;
  
  std::__cxx11::string::string((string *)&local_158,"\r\n\t\v\f ",&local_159);
  anon_unknown.dwarf_3b64::LexerWrapper::LexerWrapper(&local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  iVar1 = anon_unknown.dwarf_3b64::LexerWrapper::GetToken(&local_138);
  if (iVar1 != 0x11e) {
    std::__cxx11::string::string
              ((string *)&local_158,"\'lexer.GetToken() == luna::Token_EOF\'",&local_159);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
  }
  anon_unknown.dwarf_3b64::LexerWrapper::~LexerWrapper(&local_138);
  return;
}

Assistant:

TEST_CASE(lex1)
{
    LexerWrapper lexer("\r\n\t\v\f ");
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}